

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parseLocation_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  allocator local_39;
  string local_38;
  
  if ((object->super___shared_ptr<TgBot::Location,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_38);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::string((string *)&local_38,"longitude",&local_39);
    appendToJson<float>(this,__return_storage_ptr__,&local_38,
                        &((object->super___shared_ptr<TgBot::Location,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->longitude);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string((string *)&local_38,"latitude",&local_39);
    appendToJson<float>(this,__return_storage_ptr__,&local_38,
                        &((object->super___shared_ptr<TgBot::Location,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->latitude);
    std::__cxx11::string::~string((string *)&local_38);
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseLocation(const Location::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "longitude", object->longitude);
    appendToJson(result, "latitude", object->latitude);
    removeLastComma(result);
    result += '}';
    return result;
}